

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConfigDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ConfigRuleSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,
          SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *args_4,Token *args_5,
          SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *args_6,Token *args_7,
          SyntaxList<slang::syntax::ConfigRuleSyntax> *args_8,Token *args_9,
          NamedBlockClauseSyntax **args_10)

{
  Token name;
  Token config;
  Token semi1;
  Token design;
  Token semi2;
  Token endconfig;
  ConfigDeclarationSyntax *this_00;
  
  this_00 = (ConfigDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConfigDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ConfigDeclarationSyntax *)allocateSlow(this,0x160,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  config.kind = args_1->kind;
  config._2_1_ = args_1->field_0x2;
  config.numFlags.raw = (args_1->numFlags).raw;
  config.rawLen = args_1->rawLen;
  config.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  endconfig.kind = args_9->kind;
  endconfig._2_1_ = args_9->field_0x2;
  endconfig.numFlags.raw = (args_9->numFlags).raw;
  endconfig.rawLen = args_9->rawLen;
  endconfig.info = args_9->info;
  semi2.kind = args_7->kind;
  semi2._2_1_ = args_7->field_0x2;
  semi2.numFlags.raw = (args_7->numFlags).raw;
  semi2.rawLen = args_7->rawLen;
  semi2.info = args_7->info;
  design.kind = args_5->kind;
  design._2_1_ = args_5->field_0x2;
  design.numFlags.raw = (args_5->numFlags).raw;
  design.rawLen = args_5->rawLen;
  design.info = args_5->info;
  semi1.kind = args_3->kind;
  semi1._2_1_ = args_3->field_0x2;
  semi1.numFlags.raw = (args_3->numFlags).raw;
  semi1.rawLen = args_3->rawLen;
  semi1.info = args_3->info;
  slang::syntax::ConfigDeclarationSyntax::ConfigDeclarationSyntax
            (this_00,args,config,name,semi1,args_4,design,args_6,semi2,args_8,endconfig,*args_10);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }